

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

s3wid_t dict_wordid(dict_t *d,char *word)

{
  int32 iVar1;
  s3wid_t local_28 [2];
  void *w;
  char *word_local;
  dict_t *d_local;
  
  w = word;
  word_local = (char *)d;
  if (d == (dict_t *)0x0) {
    __assert_fail("d",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                  ,0x1e6,"s3wid_t dict_wordid(dict_t *, const char *)");
  }
  if (word != (char *)0x0) {
    iVar1 = hash_table_lookup(d->ht,word,(void **)local_28);
    if (iVar1 < 0) {
      d_local._4_4_ = -1;
    }
    else {
      d_local._4_4_ = local_28[0];
    }
    return d_local._4_4_;
  }
  __assert_fail("word",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                ,0x1e7,"s3wid_t dict_wordid(dict_t *, const char *)");
}

Assistant:

s3wid_t
dict_wordid(dict_t * d, const char *word)
{
    void *w;

    assert(d);
    assert(word);

    if (hash_table_lookup(d->ht, word, &w) < 0)
        return (BAD_S3WID);
    return ((s3wid_t)(long)w);
}